

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O3

string * __thiscall
cmLinkLineComputer::ConvertToOutputFormat
          (string *__return_storage_ptr__,cmLinkLineComputer *this,string *input)

{
  OutputFormat output;
  string_view source;
  
  output = RESPONSE;
  if ((this->ForResponse == false) && (output = WATCOMQUOTE, this->UseWatcomQuote == false)) {
    output = (uint)this->UseNinjaMulti * 2;
  }
  source._M_str = (input->_M_dataplus)._M_p;
  source._M_len = input->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (__return_storage_ptr__,this->OutputConverter,source,output);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ConvertToOutputFormat(std::string const& input)
{
  cmOutputConverter::OutputFormat shellFormat = cmOutputConverter::SHELL;
  if (this->ForResponse) {
    shellFormat = cmOutputConverter::RESPONSE;
  } else if (this->UseWatcomQuote) {
    shellFormat = cmOutputConverter::WATCOMQUOTE;
  } else if (this->UseNinjaMulti) {
    shellFormat = cmOutputConverter::NINJAMULTI;
  }

  return this->OutputConverter->ConvertToOutputFormat(input, shellFormat);
}